

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptBlock.cpp
# Opt level: O0

void __thiscall ScriptBlock::~ScriptBlock(ScriptBlock *this)

{
  LocalFunction *this_00;
  uint local_14;
  uint i;
  ScriptBlock *this_local;
  
  (this->super_ICommand)._vptr_ICommand = (_func_int **)&PTR_execute_00111890;
  for (local_14 = 0; local_14 < this->commandsCount; local_14 = local_14 + 1) {
    if (this->commands[local_14] != (ICommand *)0x0) {
      operator_delete(this->commands[local_14]);
    }
  }
  if (this->commands != (ICommand **)0x0) {
    operator_delete__(this->commands);
  }
  if ((this->isRoot & 1U) != 0) {
    for (local_14 = 0; local_14 < this->functionsCount; local_14 = local_14 + 1) {
      this_00 = this->functions[local_14];
      if (this_00 != (LocalFunction *)0x0) {
        LocalFunction::~LocalFunction(this_00);
        operator_delete(this_00);
      }
    }
    if (this->functions != (LocalFunction **)0x0) {
      operator_delete__(this->functions);
    }
  }
  return;
}

Assistant:

ScriptBlock::~ScriptBlock() {
	unsigned int i;
	for (i = 0; i < this->commandsCount; i++) {
		delete this->commands[i];
	}
	delete[] this->commands;
	
	if (this->isRoot) {
		for (i = 0; i < this->functionsCount; i++) {
			delete this->functions[i];
		}
		delete[] this->functions;
	}
}